

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_insertArray_success_zeroArraySize_fn(int _i)

{
  AString string_00;
  bool bVar1;
  int iVar2;
  char *in_stack_ffffffffffffff20;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_4;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_3;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_1;
  char *_ck_x_2;
  void *_ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  AString string;
  int _i_local;
  
  string.buffer._4_4_ = _i;
  private_ACUtilsTest_AString_constructTestString((AString *)&_ck_x,"01234567",8);
  private_ACUtilsTest_AString_setReallocFail(false,0);
  bVar1 = AString_insertCString((AString *)&_ck_x,2,"xyz",0);
  if (bVar1 == false) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x30a,"Assertion \'AString_insertCString(&string, 2, \"xyz\", 0)\' failed",0)
    ;
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x30a);
  if (string.size != 8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x30b,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string).capacity == (8)",
                      "(string).capacity",string.size,"(8)",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x30b);
  if (string.capacity == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x30b,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                      "(void*) (string).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x30b);
  _ck_y_s = (char *)string.capacity;
  if (string.capacity == 0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar2 = strcmp("01234567",(char *)string.capacity);
    if (iVar2 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x30b);
      if (string.deallocator != (ACUtilsDeallocator)0x8) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x30b,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string).size == strlen(\"01234567\")","(string).size",string.deallocator
                          ,"strlen(\"01234567\")",8,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x30b);
      if (private_ACUtilsTest_AString_reallocCount == 0) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x30c);
        string_00.deallocator = string.deallocator;
        string_00.reallocator = string.reallocator;
        string_00.size = string.size;
        string_00.capacity = string.capacity;
        string_00.buffer = in_stack_ffffffffffffff20;
        private_ACUtilsTest_AString_destructTestString(string_00);
        return;
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x30c,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                        "private_ACUtilsTest_AString_reallocCount == (0)",
                        "private_ACUtilsTest_AString_reallocCount",
                        private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x30b,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(string).buffer == (\"01234567\")","(string).buffer",_ck_y_q,_ck_y_s,_ck_y_q,
                    "(\"01234567\")","\"","01234567","\"",0);
}

Assistant:

END_TEST
START_TEST(test_AString_insertArray_success_zeroArraySize)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("01234567", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_insertCString(&string, 2, "xyz", 0));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234567", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}